

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

wchar_t getWindowState(_GLFWwindow *window)

{
  unsigned_long uVar1;
  wchar_t wVar2;
  anon_struct_16_2_032570bf *state;
  wchar_t *local_18;
  
  local_18 = (wchar_t *)0x0;
  uVar1 = _glfwGetWindowProperty
                    ((window->x11).handle,_glfw.x11.WM_STATE,_glfw.x11.WM_STATE,(uchar **)&local_18)
  ;
  wVar2 = L'\0';
  if (1 < uVar1) {
    wVar2 = *local_18;
  }
  XFree();
  return wVar2;
}

Assistant:

static int getWindowState(_GLFWwindow* window)
{
    int result = WithdrawnState;
    struct {
        CARD32 state;
        Window icon;
    } *state = NULL;

    if (_glfwGetWindowProperty(window->x11.handle,
                               _glfw.x11.WM_STATE,
                               _glfw.x11.WM_STATE,
                               (unsigned char**) &state) >= 2)
    {
        result = state->state;
    }

    XFree(state);
    return result;
}